

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopDfs.c
# Opt level: O3

void Hop_Compose_rec(Hop_Man_t *p,Hop_Obj_t *pObj,Hop_Obj_t *pFunc,Hop_Obj_t *pVar)

{
  ulong *puVar1;
  Hop_Obj_t *p1;
  Hop_Obj_t *pHVar2;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Hop_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hopDfs.c"
                  ,0x185,"void Hop_Compose_rec(Hop_Man_t *, Hop_Obj_t *, Hop_Obj_t *, Hop_Obj_t *)")
    ;
  }
  if ((*(uint *)&pObj->field_0x20 & 0x10) == 0) {
    if ((*(uint *)&pObj->field_0x20 & 7) - 1 < 2) {
      if (pObj != pVar) {
        pFunc = pObj;
      }
      (pObj->field_0).pData = pFunc;
    }
    else {
      Hop_Compose_rec(p,(Hop_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),pFunc,pVar);
      Hop_Compose_rec(p,(Hop_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),pFunc,pVar);
      puVar1 = (ulong *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe);
      if (puVar1 == (ulong *)0x0) {
        pHVar2 = (Hop_Obj_t *)0x0;
      }
      else {
        pHVar2 = (Hop_Obj_t *)((ulong)((uint)pObj->pFanin0 & 1) ^ *puVar1);
      }
      puVar1 = (ulong *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe);
      if (puVar1 == (ulong *)0x0) {
        p1 = (Hop_Obj_t *)0x0;
      }
      else {
        p1 = (Hop_Obj_t *)((ulong)((uint)pObj->pFanin1 & 1) ^ *puVar1);
      }
      pHVar2 = Hop_And(p,pHVar2,p1);
      (pObj->field_0).pData = pHVar2;
      if ((*(uint *)&pObj->field_0x20 & 0x10) != 0) {
        __assert_fail("!Hop_ObjIsMarkA(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hopDfs.c"
                      ,400,
                      "void Hop_Compose_rec(Hop_Man_t *, Hop_Obj_t *, Hop_Obj_t *, Hop_Obj_t *)");
      }
      *(uint *)&pObj->field_0x20 = *(uint *)&pObj->field_0x20 | 0x10;
    }
  }
  return;
}

Assistant:

void Hop_Compose_rec( Hop_Man_t * p, Hop_Obj_t * pObj, Hop_Obj_t * pFunc, Hop_Obj_t * pVar )
{
    assert( !Hop_IsComplement(pObj) );
    if ( Hop_ObjIsMarkA(pObj) )
        return;
    if ( Hop_ObjIsConst1(pObj) || Hop_ObjIsPi(pObj) )
    {
        pObj->pData = pObj == pVar ? pFunc : pObj;
        return;
    }
    Hop_Compose_rec( p, Hop_ObjFanin0(pObj), pFunc, pVar ); 
    Hop_Compose_rec( p, Hop_ObjFanin1(pObj), pFunc, pVar );
    pObj->pData = Hop_And( p, Hop_ObjChild0Copy(pObj), Hop_ObjChild1Copy(pObj) );
    assert( !Hop_ObjIsMarkA(pObj) ); // loop detection
    Hop_ObjSetMarkA( pObj );
}